

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::setTransitionMatrices
          (BeagleCPUImpl<double,_1,_0> *this,int *matrixIndices,double *inMatrices,
          double *paddedValues,int count)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  double *__src;
  int iVar4;
  double *__dest;
  int iVar5;
  ulong uVar6;
  
  if (0 < count) {
    iVar5 = this->kCategoryCount;
    uVar6 = 0;
    iVar3 = iVar5;
    do {
      if (0 < iVar3) {
        __dest = this->gTransitionMatrices[matrixIndices[uVar6]];
        uVar1 = this->kStateCount;
        uVar2 = (ulong)uVar1;
        __src = inMatrices + (int)(iVar3 * uVar1 * (int)uVar6 * uVar1);
        iVar4 = 0;
        do {
          if (0 < (int)uVar2) {
            iVar5 = 0;
            do {
              memcpy(__dest,__src,(uVar2 & 0xffffffff) << 3);
              iVar3 = this->kStateCount;
              uVar2 = (ulong)iVar3;
              iVar5 = iVar5 + 1;
              __src = __src + uVar2;
              __dest[uVar2] = paddedValues[uVar6];
              __dest = __dest + this->kTransPaddedStateCount;
            } while (iVar5 < iVar3);
            iVar5 = this->kCategoryCount;
          }
          iVar4 = iVar4 + 1;
          iVar3 = iVar5;
        } while (iVar4 < iVar5);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uint)count);
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setTransitionMatrices(const int* matrixIndices,
                                                             const double* inMatrices,
                                                             const double* paddedValues,
                                                             int count) {
    for (int k = 0; k < count; k++) {
        const double* inMatrix = inMatrices + k*kStateCount*kStateCount*kCategoryCount;
        int matrixIndex = matrixIndices[k];

if (T_PAD != 0) {
        const double* offsetInMatrix = inMatrix;
        REALTYPE* offsetBeagleMatrix = gTransitionMatrices[matrixIndex];
        for(int i = 0; i < kCategoryCount; i++) {
            for(int j = 0; j < kStateCount; j++) {
                beagleMemCpy(offsetBeagleMatrix, offsetInMatrix, kStateCount);
                offsetBeagleMatrix[kStateCount] = paddedValues[k];
                offsetBeagleMatrix += kTransPaddedStateCount; // Skip padding
                offsetInMatrix += kStateCount;
            }
        }
} else {
        beagleMemCpy(gTransitionMatrices[matrixIndex], inMatrix,
                     kMatrixSize * kCategoryCount);
}
    }

    return BEAGLE_SUCCESS;
}